

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O0

vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
* get_tensor_configs(mt19937 *rng)

{
  int iVar1;
  result_type rVar2;
  long lVar3;
  reference pvVar4;
  result_type rVar5;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  *in_RDI;
  int i_1;
  int n_dims;
  array<long,_4UL> shape;
  ggml_type type;
  int i;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  *tensor_configs;
  value_type *in_stack_ffffffffffffff18;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff48;
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  *in_stack_ffffffffffffff50;
  undefined4 local_60;
  undefined4 local_28;
  
  std::
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  ::vector((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
            *)0x10fa81);
  std::
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  ::reserve(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  for (local_28 = 0; local_28 < 100; local_28 = local_28 + 1) {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(in_stack_ffffffffffffff20);
    iVar1 = (int)rVar2 + (int)(rVar2 / 0x27) * -0x27;
    lVar3 = ggml_type_size(iVar1);
    if (lVar3 != 0) {
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(in_stack_ffffffffffffff20);
      lVar3 = ggml_blck_size(iVar1);
      lVar3 = (rVar2 + 1 + (rVar2 / 5 & 0xfffffffffffffffe) * -5) * lVar3;
      pvVar4 = std::array<long,_4UL>::operator[]
                         ((array<long,_4UL> *)in_stack_ffffffffffffff20,
                          (size_type)in_stack_ffffffffffffff18);
      *pvVar4 = lVar3;
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(in_stack_ffffffffffffff20);
      for (local_60 = 1; local_60 < (int)(((uint)rVar2 & 3) + 1); local_60 = local_60 + 1) {
        rVar5 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(in_stack_ffffffffffffff20);
        in_stack_ffffffffffffff20 =
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)(rVar5 % 10 + 1);
        pvVar4 = std::array<long,_4UL>::operator[]
                           ((array<long,_4UL> *)in_stack_ffffffffffffff20,
                            (size_type)in_stack_ffffffffffffff18);
        *pvVar4 = (value_type_conflict1)in_stack_ffffffffffffff20;
      }
      std::make_pair<ggml_type_const&,std::array<long,4ul>&>
                ((ggml_type *)in_stack_ffffffffffffff20,
                 (array<long,_4UL> *)in_stack_ffffffffffffff18);
      std::
      vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
      ::push_back((vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                   *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
  }
  return in_RDI;
}

Assistant:

static std::vector<tensor_config_t> get_tensor_configs(std::mt19937 & rng) {
    std::vector<tensor_config_t> tensor_configs;
    tensor_configs.reserve(100);

    for (int i = 0; i < 100; ++i) {
        const enum ggml_type type = ggml_type(rng() % GGML_TYPE_COUNT);
        if (ggml_type_size(type) == 0) {
            continue;
        }

        std::array<int64_t, GGML_MAX_DIMS> shape = {1, 1, 1, 1};
        shape[0] = (1 + rng() % 10) * ggml_blck_size(type);
        const int n_dims = 1 + rng() % GGML_MAX_DIMS;
        for (int i = 1; i < n_dims; ++i) {
            shape[i] = 1 + rng() % 10;
        }

        tensor_configs.push_back(std::make_pair(type, shape));
    }

    return tensor_configs;
}